

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

ObjPipeline * rw::ObjPipeline::create(void)

{
  ObjPipeline *this;
  ObjPipeline *pipe;
  
  this = (ObjPipeline *)
         mustmalloc_LOC(0x28,0x40000,
                        "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/pipeline.cpp line: 31"
                       );
  init(this,(EVP_PKEY_CTX *)0x0);
  return this;
}

Assistant:

ObjPipeline*
ObjPipeline::create(void)
{
	ObjPipeline *pipe = rwNewT(ObjPipeline, 1, MEMDUR_GLOBAL);
	pipe->init(PLATFORM_NULL);
	return pipe;
}